

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incppect.cpp
# Opt level: O1

thread __thiscall Incppect<false>::runAsync(Incppect<false> *this,Parameters *parameters)

{
  Parameters *in_RDX;
  anon_class_152_2_9f0aae65_for__M_head_impl local_a8;
  
  local_a8.this = (Incppect<false> *)parameters;
  Parameters::Parameters(&local_a8.parameters,in_RDX);
  std::thread::thread<Incppect<false>::runAsync(Incppect<false>::Parameters)::_lambda()_1_,,void>
            ((thread *)this,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.parameters.sslCert._M_dataplus._M_p != &local_a8.parameters.sslCert.field_2) {
    operator_delete(local_a8.parameters.sslCert._M_dataplus._M_p,
                    local_a8.parameters.sslCert.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.parameters.sslKey._M_dataplus._M_p != &local_a8.parameters.sslKey.field_2) {
    operator_delete(local_a8.parameters.sslKey._M_dataplus._M_p,
                    local_a8.parameters.sslKey.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.parameters.resources);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.parameters.httpRoot._M_dataplus._M_p != &local_a8.parameters.httpRoot.field_2) {
    operator_delete(local_a8.parameters.httpRoot._M_dataplus._M_p,
                    local_a8.parameters.httpRoot.field_2._M_allocated_capacity + 1);
  }
  return (thread)(id)this;
}

Assistant:

std::thread Incppect<SSL>::runAsync(Parameters parameters) {
    std::thread worker([this, parameters]() { this->run(parameters); });
    return worker;
}